

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O3

void __thiscall
snestistics::EmulateRegisters::write_word
          (EmulateRegisters *this,uint32_t address,uint16_t v,MemoryAccessType reason)

{
  byte bVar1;
  uint16_t a;
  uint8_t channels;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = address >> 0x10;
  uVar3 = address & 0xffff;
  if (((uVar3 < 0x8000) && ((address >> 0x16 & 1) == 0)) && (uVar4 = 0x7e, 0x1fff < uVar3)) {
    uVar4 = 0;
  }
  uVar2 = (uVar4 & 0xff) << 0x10;
  uVar3 = uVar2 | uVar3;
  channels = (uint8_t)(v >> 8);
  if ((uVar2 | address & 0xff00) == 0x2100) {
    special_write_a(this,uVar3,(uint8_t)v);
    special_write_a(this,uVar3 + 1,channels);
    bVar1 = 1;
  }
  else if (uVar3 - 0x4200 < 0x300) {
    bVar1 = 1;
    if ((uVar3 == 0x420a) || (channels = (uint8_t)v, uVar3 == 0x420b)) {
      execute_dma(this,channels);
    }
  }
  else {
    bVar1 = 0;
  }
  if (this->_write_function != (memoryAccessFunc)0x0) {
    (*this->_write_function)(this->_callback_context,address,uVar3,(uint32_t)v,2,reason);
  }
  if (!(bool)((uVar4 & 0xfe) != 0x7e & (bVar1 ^ 1))) {
    *(uint16_t *)(this->_memory + uVar3) = v;
  }
  return;
}

Assistant:

inline void write_word(uint32_t address, uint16_t v, MemoryAccessType reason) {
		uint32_t r = remap(address);

		bool sw = false;

		if (r >= 0x002100 && r <= 0x0021FF) {
			special_write_a(r, v&0xFF);
			special_write_a((r+1)&0xFFFF, v>>8);
			sw = true;
		} else if (r >= 0x004200 && r <= 0x0044ff) {
			special_write_b(r, v&0xFF);
			special_write_b((r+1), (v>>8)&0xFF);
			sw = true;
		}

		if(_write_function)
			(*_write_function)(_callback_context, address, r, v, 2, reason);

		// Don't allow writing to memory mapped registers, SRAM etc...
		// NOTE: Remap remaps to 7E when needed
		uint8_t bank = r>>16;
		if (bank != 0x7E && bank != 0x7F && !sw)
			return;

		*((uint16_t*)&(_memory[r])) = v;
	}